

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O2

void __thiscall
duckdb::RLECompressState<unsigned_char,_true>::Append
          (RLECompressState<unsigned_char,_true> *this,UnifiedVectorFormat *vdata,idx_t count)

{
  uchar *data;
  sel_t *psVar1;
  idx_t idx;
  idx_t i;
  idx_t iVar2;
  
  data = vdata->data;
  for (iVar2 = 0; count != iVar2; iVar2 = iVar2 + 1) {
    psVar1 = vdata->sel->sel_vector;
    idx = iVar2;
    if (psVar1 != (sel_t *)0x0) {
      idx = (idx_t)psVar1[iVar2];
    }
    RLEState<unsigned_char>::Update<duckdb::RLECompressState<unsigned_char,true>::RLEWriter>
              (&this->state,data,&vdata->validity,idx);
  }
  return;
}

Assistant:

void Append(UnifiedVectorFormat &vdata, idx_t count) {
		auto data = UnifiedVectorFormat::GetData<T>(vdata);
		for (idx_t i = 0; i < count; i++) {
			auto idx = vdata.sel->get_index(i);
			state.template Update<RLECompressState<T, WRITE_STATISTICS>::RLEWriter>(data, vdata.validity, idx);
		}
	}